

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true> __thiscall
duckdb::DataTable::InitializeDelete
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  size_type *this_00;
  pointer puVar1;
  _Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_> _Var2;
  DataTableInfo *table_info;
  element_type *peVar3;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar4;
  pointer pCVar5;
  ForeignKeyConstraint *pFVar6;
  pointer pTVar7;
  reference pvVar8;
  storage_t *__args;
  LogicalType *__args_00;
  Allocator *allocator;
  _Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_> _Var9;
  NotImplementedException *this_01;
  bool bVar10;
  pointer *__ptr_1;
  undefined8 in_R8;
  pointer this_02;
  size_type __n;
  pointer *__ptr;
  vector<duckdb::LogicalType,_true> types;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::LogicalType,_true> local_88;
  undefined8 local_70;
  ClientContext *local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  local_70 = in_R8;
  table_info = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                         ((shared_ptr<duckdb::DataTableInfo,_true> *)
                          &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.set)
  ;
  TableIndexList::InitializeIndexes
            (&table_info->indexes,(ClientContext *)bound_constraints,table_info,(char *)0x0);
  Binder::CreateBinder
            ((Binder *)local_60,(ClientContext *)bound_constraints,
             (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3 = (element_type *)operator_new(0x68);
  *(undefined8 *)((long)&(peVar3->append_lock).super___mutex_base + 0x10) = 0;
  *(undefined8 *)((long)&(peVar3->append_lock).super___mutex_base + 0x18) = 0;
  *(undefined8 *)&(peVar3->append_lock).super___mutex_base._M_mutex = 0;
  *(undefined8 *)((long)&(peVar3->append_lock).super___mutex_base + 8) = 0;
  *(pointer *)
   ((long)&(peVar3->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(peVar3->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> + 0x10)
       = (pointer)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(peVar3->info).internal + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &(peVar3->column_definitions).
    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> = 0;
  peVar3->db = (AttachedDatabase *)0x0;
  (peVar3->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = 0;
  *(undefined8 *)&(peVar3->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_ = 0;
  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(peVar3->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_ + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)((long)&(peVar3->append_lock).super___mutex_base + 0x20) = 0;
  local_68 = (ClientContext *)bound_constraints;
  DataChunk::DataChunk((DataChunk *)&peVar3->db);
  *(undefined8 *)((long)&(peVar3->append_lock).super___mutex_base + 0x10) = 0;
  *(undefined8 *)((long)&(peVar3->append_lock).super___mutex_base + 0x18) = 0;
  *(undefined8 *)((long)&(peVar3->append_lock).super___mutex_base + 0x20) = 0;
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  pvVar4 = TableCatalogEntry::GetConstraints((TableCatalogEntry *)context);
  this_02 = (pvVar4->
            super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pvVar4->
           super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_02 == puVar1) {
      bVar10 = false;
LAB_00648a5f:
      pTVar7 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
               ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                             *)this);
      pTVar7->has_delete_constraints = bVar10;
      pTVar7 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
               ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                             *)this);
      if (pTVar7->has_delete_constraints == true) {
        if ((table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.field_2.
            _M_allocated_capacity !=
            (table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
            _M_string_length) {
          this_00 = &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                     _M_string_length;
          __n = 0;
          do {
            pTVar7 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                     ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                                   *)this);
            pvVar8 = vector<duckdb::ColumnDefinition,_true>::operator[]
                               ((vector<duckdb::ColumnDefinition,_true> *)this_00,__n);
            __args = ColumnDefinition::StorageOid(pvVar8);
            ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
            emplace_back<unsigned_long_const&>
                      ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)
                       &pTVar7->col_ids,__args);
            pvVar8 = vector<duckdb::ColumnDefinition,_true>::operator[]
                               ((vector<duckdb::ColumnDefinition,_true> *)this_00,__n);
            __args_00 = ColumnDefinition::Type(pvVar8);
            ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
            emplace_back<duckdb::LogicalType_const&>
                      ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_88,
                       __args_00);
            __n = __n + 1;
          } while (__n < (ulong)(((long)((table->super_StandardEntry).super_InCatalogEntry.
                                         super_CatalogEntry.name.field_2._M_allocated_capacity -
                                        (table->super_StandardEntry).super_InCatalogEntry.
                                        super_CatalogEntry.name._M_string_length) >> 3) *
                                -0x7b425ed097b425ed));
        }
        pTVar7 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                 ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                               *)this);
        allocator = Allocator::Get(local_68);
        DataChunk::Initialize(&pTVar7->verify_chunk,allocator,&local_88,0x800);
        _Var9.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::ConstraintState_*,_false>)operator_new(0x10);
        *(ClientContext **)
         _Var9.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl = context;
        *(undefined8 *)
         ((long)_Var9.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl + 8) =
             local_70;
        pTVar7 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                 ::operator->((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
                               *)this);
        _Var2.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
             (pTVar7->constraint_state).
             super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
             .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>;
        (pTVar7->constraint_state).
        super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
        .super__Head_base<0UL,_duckdb::ConstraintState_*,_false> =
             _Var9.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl;
        if (_Var2.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl !=
            (ConstraintState *)0x0) {
          operator_delete((void *)_Var2.super__Head_base<0UL,_duckdb::ConstraintState_*,_false>.
                                  _M_head_impl);
        }
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
      return (unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>)
             (unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>)
             this;
    }
    pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_02);
    if (2 < pCVar5->type - 1) {
      if (pCVar5->type != FOREIGN_KEY) {
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = local_50 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Constraint type not implemented!","");
        NotImplementedException::NotImplementedException(this_01,(string *)local_50);
        __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_02);
      pFVar6 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar5);
      if (((pFVar6->info).type & ~FK_TYPE_SELF_REFERENCE_TABLE) == FK_TYPE_PRIMARY_KEY_TABLE) {
        bVar10 = true;
        goto LAB_00648a5f;
      }
    }
    this_02 = this_02 + 1;
  } while( true );
}

Assistant:

unique_ptr<TableDeleteState> DataTable::InitializeDelete(TableCatalogEntry &table, ClientContext &context,
                                                         const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	// initialize indexes (if any)
	info->InitializeIndexes(context);

	auto binder = Binder::CreateBinder(context);
	vector<LogicalType> types;
	auto result = make_uniq<TableDeleteState>();
	result->has_delete_constraints = TableHasDeleteConstraints(table);
	if (result->has_delete_constraints) {
		// initialize the chunk if there are any constraints to verify
		for (idx_t i = 0; i < column_definitions.size(); i++) {
			result->col_ids.emplace_back(column_definitions[i].StorageOid());
			types.emplace_back(column_definitions[i].Type());
		}
		result->verify_chunk.Initialize(Allocator::Get(context), types);
		result->constraint_state = make_uniq<ConstraintState>(table, bound_constraints);
	}
	return result;
}